

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O1

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::CovergroupBodySymbol>
          (ASTSerializer *this,CovergroupBodySymbol *elem,bool inMembersArray)

{
  char *__s;
  Scope *pSVar1;
  size_t sVar2;
  long lVar3;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar4;
  string_view name;
  string_view sVar5;
  string_view value;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  iterator __begin0;
  bool local_3a;
  bool local_39;
  iterator local_38;
  
  JsonWriter::startObject(this->writer);
  sVar5 = (elem->super_Symbol).name;
  name._M_str = "name";
  name._M_len = 4;
  JsonWriter::writeProperty(this->writer,name);
  JsonWriter::writeValue(this->writer,sVar5);
  __s = *(char **)(toString(slang::ast::SymbolKind)::strings +
                  (long)(int)(elem->super_Symbol).kind * 8);
  sVar2 = strlen(__s);
  sVar5._M_str = "kind";
  sVar5._M_len = 4;
  JsonWriter::writeProperty(this->writer,sVar5);
  value._M_str = __s;
  value._M_len = sVar2;
  JsonWriter::writeValue(this->writer,value);
  if (this->includeAddrs == true) {
    name_00._M_str = "addr";
    name_00._M_len = 4;
    JsonWriter::writeProperty(this->writer,name_00);
    JsonWriter::writeValue(this->writer,(uint64_t)elem);
  }
  pSVar1 = (elem->super_Symbol).parentScope;
  if (pSVar1 != (Scope *)0x0) {
    sVar4 = Compilation::getAttributes(pSVar1->compilation,&elem->super_Symbol);
    if (sVar4.size_ != 0) {
      name_01._M_str = "attributes";
      name_01._M_len = 10;
      JsonWriter::writeProperty(this->writer,name_01);
      JsonWriter::startArray(this->writer);
      lVar3 = 0;
      do {
        local_3a = false;
        Symbol::visit<slang::ast::ASTSerializer&,bool&>
                  (*(Symbol **)((long)sVar4.data_ + lVar3),this,&local_3a);
        lVar3 = lVar3 + 8;
      } while (sVar4.size_ << 3 != lVar3);
      JsonWriter::endArray(this->writer);
    }
  }
  if ((elem->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&elem->super_Scope);
  }
  if ((elem->super_Scope).firstMember != (Symbol *)0x0) {
    name_02._M_str = "members";
    name_02._M_len = 7;
    JsonWriter::writeProperty(this->writer,name_02);
    JsonWriter::startArray(this->writer);
    if ((elem->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&elem->super_Scope);
    }
    local_38.current = (elem->super_Scope).firstMember;
    if (local_38.current != (Symbol *)0x0) {
      do {
        local_39 = true;
        Symbol::visit<slang::ast::ASTSerializer&,bool&>(local_38.current,this,&local_39);
        Scope::iterator::operator++(&local_38);
      } while (local_38.current != (Symbol *)0x0);
    }
    JsonWriter::endArray(this->writer);
  }
  CovergroupBodySymbol::serializeTo(elem,this);
  JsonWriter::endObject(this->writer);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    // TODO: remove once we no longer support gcc-10
    (void)inMembersArray;

    if constexpr (std::is_base_of_v<Expression, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        write("type", *elem.type);

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        EvalContext ctx(compilation, EvalFlags::CacheResults);
        ConstantValue constant = elem.eval(ctx);
        if (constant)
            write("constant", constant);

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Type, T> && !std::is_same_v<TypeAliasType, T> &&
                       !std::is_same_v<ClassType, T> && !std::is_same_v<CovergroupType, T>) {
        writer.writeValue(elem.toString());
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            if (!inMembersArray) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::NotConst | MethodFlags::Randomize))
                return;
        }

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto scope = elem.getParentScope();
        if (scope) {
            auto attributes = scope->getCompilation().getAttributes(elem);
            if (!attributes.empty()) {
                startArray("attributes");
                for (auto attr : attributes)
                    serialize(*attr);
                endArray();
            }
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
}